

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_query.hpp
# Opt level: O2

void __thiscall
asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
          (basic_resolver_query<asio::ip::udp> *this,protocol_type *protocol,string *host,
          string *service,flags resolve_flags)

{
  (this->hints_).ai_canonname = (char *)0x0;
  (this->hints_).ai_next = (addrinfo *)0x0;
  *(undefined8 *)&(this->hints_).ai_addrlen = 0;
  (this->hints_).ai_addr = (sockaddr *)0x0;
  (this->hints_).ai_flags = 0;
  (this->hints_).ai_family = 0;
  (this->hints_).ai_socktype = 0;
  (this->hints_).ai_protocol = 0;
  std::__cxx11::string::string
            ((string *)&this->host_name_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)host);
  std::__cxx11::string::string
            ((string *)&this->service_name_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)service);
  (this->hints_).ai_flags = resolve_flags;
  (this->hints_).ai_family = protocol->family_;
  (this->hints_).ai_socktype = 2;
  (this->hints_).ai_protocol = 0x11;
  (this->hints_).ai_addrlen = 0;
  (this->hints_).ai_addr = (sockaddr *)0x0;
  (this->hints_).ai_canonname = (char *)0x0;
  (this->hints_).ai_next = (addrinfo *)0x0;
  return;
}

Assistant:

basic_resolver_query(const protocol_type& protocol,
      const std::string& host, const std::string& service,
      resolver_query_base::flags resolve_flags = address_configured)
    : hints_(),
      host_name_(host),
      service_name_(service)
  {
    hints_.ai_flags = static_cast<int>(resolve_flags);
    hints_.ai_family = protocol.family();
    hints_.ai_socktype = protocol.type();
    hints_.ai_protocol = protocol.protocol();
    hints_.ai_addrlen = 0;
    hints_.ai_canonname = 0;
    hints_.ai_addr = 0;
    hints_.ai_next = 0;
  }